

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

char decLuhnCalc(char *dec)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = strLen(dec);
  if (sVar4 == 0) {
    bVar3 = 0x30;
  }
  else {
    uVar5 = 0;
    do {
      uVar5 = uVar5 + *(long *)((long)dec[sVar4 - 1] * 8 + 0x14ffe0);
      if (sVar4 == 1) break;
      uVar5 = (uVar5 + (long)dec[sVar4 - 2]) - 0x30;
      sVar4 = sVar4 - 2;
    } while (sVar4 != 0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    uVar2 = ((int)uVar5 + (SUB164(auVar1 * ZEXT816(0xcccccccccccccccd),8) >> 2 & 0xfffffffe) * -5) *
            9;
    bVar3 = (char)uVar2 + ((byte)((uVar2 & 0xff) / 5) & 0xfe) * -5 | 0x30;
  }
  return bVar3;
}

Assistant:

char decLuhnCalc(const char* dec)
{
	register word cd = 0;
	size_t i;
	ASSERT(decIsValid(dec));
	for (i = strLen(dec); i--;) 
	{
		cd += luhn_table[dec[i] - '0'];
		if (i)
			cd += dec[--i] - '0';
	}
	cd %= 10, cd = ((cd << 3) + cd) % 10;
	return (char)cd + '0';
}